

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration.cpp
# Opt level: O2

QOffscreenIntegration * QOffscreenIntegration::createOffscreenIntegration(QStringList *paramList)

{
  qsizetype qVar1;
  QOffscreenIntegration *this;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.size = -0x5555555555555556;
  local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_38.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_38);
  qVar1 = local_38.size;
  this = (QOffscreenIntegration *)operator_new(0x58);
  if (qVar1 == 0) {
    QOffscreenX11Integration::QOffscreenX11Integration((QOffscreenX11Integration *)this,paramList);
  }
  else {
    QOffscreenIntegration(this,paramList);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QOffscreenIntegration *QOffscreenIntegration::createOffscreenIntegration(const QStringList& paramList)
{
    QOffscreenIntegration *offscreenIntegration = nullptr;

#if QT_CONFIG(xlib) && QT_CONFIG(opengl) && !QT_CONFIG(opengles2)
    QByteArray glx = qgetenv("QT_QPA_OFFSCREEN_NO_GLX");
    if (glx.isEmpty())
        offscreenIntegration = new QOffscreenX11Integration(paramList);
#endif

     if (!offscreenIntegration)
        offscreenIntegration = new QOffscreenIntegration(paramList);
    return offscreenIntegration;
}